

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void delay_move(_glist *x)

{
  int *piVar1;
  int iVar2;
  t_editor *ptVar3;
  int dx;
  int dy;
  
  ptVar3 = x->gl_editor;
  dx = (ptVar3->e_xnew - ptVar3->e_xwas) / x->gl_zoom;
  dy = (ptVar3->e_ynew - ptVar3->e_ywas) / x->gl_zoom;
  if (dx != 0 || dy != 0) {
    canvas_displaceselection(x,dx,dy);
  }
  iVar2 = x->gl_zoom;
  ptVar3 = x->gl_editor;
  piVar1 = &ptVar3->e_xwas;
  *piVar1 = *piVar1 + dx * iVar2;
  piVar1 = &ptVar3->e_ywas;
  *piVar1 = *piVar1 + dy * iVar2;
  return;
}

Assistant:

static void delay_move(t_canvas *x)
{
    int incx = (x->gl_editor->e_xnew - x->gl_editor->e_xwas)/x->gl_zoom,
        incy = (x->gl_editor->e_ynew - x->gl_editor->e_ywas)/x->gl_zoom;
    if (incx || incy)
        canvas_displaceselection(x, incx, incy);
    x->gl_editor->e_xwas += incx * x->gl_zoom;
    x->gl_editor->e_ywas += incy * x->gl_zoom;
}